

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

word_type __thiscall
bv::internal::bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
get(bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
   size_t begin,size_t end)

{
  sbyte sVar1;
  reference puVar2;
  byte bVar3;
  ulong uVar4;
  iterator *this_00;
  ulong uVar5;
  
  this_00 = &(this->_container).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_start;
  uVar5 = end - (end != 0) >> 6;
  puVar2 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                     (this_00,uVar5);
  bVar3 = 0x40 - (-(char)end & 0x3fU);
  sVar1 = (bVar3 < 0x41) * ('@' - bVar3);
  uVar4 = (*puVar2 << sVar1) >> sVar1;
  if (begin >> 6 < uVar5) {
    puVar2 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (this_00,begin >> 6);
    bVar3 = (byte)begin & 0x3f;
    uVar5 = *puVar2 >> bVar3 | uVar4 << 0x40 - bVar3;
  }
  else {
    uVar5 = 0;
    if (begin < end) {
      uVar5 = uVar4 >> (begin & 0x3f);
    }
  }
  return uVar5;
}

Assistant:

bitview_base::word_type
        bitview<C>::get(size_t begin, size_t end) const
        {
            static constexpr size_t bits = bitsize<word_type>();
            static constexpr size_t mask = ~ size_t(0) / bits * bits;
            
            // everything above has been computed at compile time.
            // Now do some work:
            
            // the index in the container of
            // the lower or higher item needed
            size_t lo_index = (begin          ) / bits;
            size_t hi_index = (end - (end > 0)) / bits;
            
            // we read container[hi_adr] first and possibly delete
            // the highest bits:
            size_t hi_shift = size_t(mask - end) % bits;
            word_type hi_val = _container[hi_index] << hi_shift >> hi_shift;
            
            // if all bits are in the same item,
            // we delete the lower bits and are done:
            size_t lo_shift = begin % bits;
            if ( hi_index <= lo_index )
                return (hi_val >> lo_shift) * (begin < end);
            
            // else we have to read the lower item as well, and combine both
            return ( hi_val << (bits - lo_shift)    |
                     _container[lo_index] >> lo_shift );
            
        }